

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O1

void Gia_ManDumpTestsSimulate(Gia_Man_t *p,Vec_Int_t *vValues)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  
  if (vValues->nSize != p->vCis->nSize) {
    __assert_fail("Vec_IntSize(vValues) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcFault.c"
                  ,0x2ea,"void Gia_ManDumpTestsSimulate(Gia_Man_t *, Vec_Int_t *)");
  }
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  pVVar6 = p->vCis;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      iVar4 = pVVar6->pArray[lVar5];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00514d0c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (vValues->nSize <= lVar5) goto LAB_00514d2b;
      pGVar2 = p->pObjs + iVar4;
      *(ulong *)pGVar2 =
           *(ulong *)pGVar2 & 0xffffffffbfffffff | (ulong)((vValues->pArray[lVar5] & 1U) << 0x1e);
      lVar5 = lVar5 + 1;
      pVVar6 = p->vCis;
    } while (lVar5 < pVVar6->nSize);
  }
  if (0 < p->nObjs) {
    lVar5 = 0;
    lVar9 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar3 = *(ulong *)(&pGVar2->field_0x0 + lVar5);
      if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar3) {
        *(ulong *)(&pGVar2->field_0x0 + lVar5) =
             uVar3 & 0xffffffff3fffffff |
             (ulong)((((uint)(uVar3 >> 0x3d) ^
                      *(uint *)((long)pGVar2 +
                               (ulong)((uint)(uVar3 >> 0x1e) & 0x7ffffffc) * -3 + lVar5) >> 0x1e) &
                      ((uint)(uVar3 >> 0x1d) & 7 ^
                      *(uint *)((long)pGVar2 +
                               (ulong)(uint)((int)(uVar3 & 0x1fffffff) << 2) * -3 + lVar5) >> 0x1e)
                     & 1) << 0x1e);
      }
      lVar9 = lVar9 + 1;
      lVar5 = lVar5 + 0xc;
    } while (lVar9 < p->nObjs);
  }
  pVVar6 = p->vCos;
  if (0 < pVVar6->nSize) {
    lVar5 = 0;
    do {
      iVar4 = pVVar6->pArray[lVar5];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_00514d0c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar4;
      uVar7 = (uint)*(ulong *)pGVar2;
      *(ulong *)pGVar2 =
           *(ulong *)pGVar2 & 0xffffffffbfffffff |
           (ulong)((uVar7 * 2 ^ *(uint *)(pGVar2 + -(ulong)(uVar7 & 0x1fffffff))) & 0x40000000);
      lVar5 = lVar5 + 1;
      pVVar6 = p->vCos;
    } while (lVar5 < pVVar6->nSize);
  }
  vValues->nSize = 0;
  iVar4 = p->nRegs;
  if (0 < iVar4) {
    iVar8 = 0;
    do {
      iVar1 = p->vCos->nSize;
      uVar7 = (iVar1 - iVar4) + iVar8;
      if (((int)uVar7 < 0) || (iVar1 <= (int)uVar7)) {
LAB_00514d2b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vCos->pArray[uVar7];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_00514d0c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Vec_IntPush(vValues,*(uint *)(p->pObjs + iVar1) >> 0x1e & 1);
      iVar8 = iVar8 + 1;
      iVar4 = p->nRegs;
    } while (iVar8 < iVar4);
  }
  if (vValues->nSize == iVar4) {
    return;
  }
  __assert_fail("Vec_IntSize(vValues) == Gia_ManRegNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcFault.c"
                ,0x2f7,"void Gia_ManDumpTestsSimulate(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

void Gia_ManDumpTestsSimulate( Gia_Man_t * p, Vec_Int_t * vValues )
{
    Gia_Obj_t * pObj; int k;
    assert( Vec_IntSize(vValues) == Gia_ManCiNum(p) );
    Gia_ManConst0(p)->fMark0 = 0;
    Gia_ManForEachCi( p, pObj, k )
        pObj->fMark0 = Vec_IntEntry( vValues, k );
    Gia_ManForEachAnd( p, pObj, k )
        pObj->fMark0 = (Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj)) & 
                       (Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj));
    Gia_ManForEachCo( p, pObj, k )
        pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
    // collect flop input values
    Vec_IntClear( vValues );
    Gia_ManForEachRi( p, pObj, k )
        Vec_IntPush( vValues, pObj->fMark0 );
    assert( Vec_IntSize(vValues) == Gia_ManRegNum(p) );
}